

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

int32_t __thiscall icu_63::RegexCompile::allocateStackData(RegexCompile *this,int32_t size)

{
  int iVar1;
  int iVar2;
  UErrorCode e;
  
  iVar2 = 0;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    e = U_REGEX_ERROR_START;
    iVar2 = 0;
    if (0xfffffeff < size - 0x101U) {
      iVar1 = this->fRXPat->fFrameSize;
      iVar2 = 0;
      if (-1 < iVar1) {
        this->fRXPat->fFrameSize = size + iVar1;
        e = U_REGEX_PATTERN_TOO_BIG;
        iVar2 = iVar1;
        if (size + iVar1 < 0xfffff0) {
          return iVar1;
        }
      }
    }
    error(this,e);
  }
  return iVar2;
}

Assistant:

int32_t RegexCompile::allocateStackData(int32_t size) {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    if (size <= 0 || size > 0x100 || fRXPat->fFrameSize < 0) {
        error(U_REGEX_INTERNAL_ERROR);
        return 0;
    }
    int32_t dataIndex = fRXPat->fFrameSize;
    fRXPat->fFrameSize += size;
    if (fRXPat->fFrameSize >= 0x00fffff0) {
        error(U_REGEX_PATTERN_TOO_BIG);
    }
    return dataIndex;
}